

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O1

vector vector_create_reserve(size_t type_size,size_t capacity)

{
  vector __ptr;
  void *pvVar1;
  undefined8 uVar2;
  size_t sVar3;
  char *pcVar4;
  
  if (type_size == 0) {
    pcVar4 = "Vector invalid type size";
    uVar2 = 0x6d;
  }
  else {
    __ptr = (vector)malloc(0x20);
    if (__ptr != (vector)0x0) {
      sVar3 = 0x10;
      if (0x10 < capacity) {
        sVar3 = capacity;
      }
      __ptr->type_size = type_size;
      __ptr->capacity = sVar3;
      __ptr->size = 0;
      pvVar1 = malloc(sVar3 * type_size);
      __ptr->data = pvVar1;
      if (pvVar1 != (void *)0x0) {
        return __ptr;
      }
      log_write_impl_va("metacall",99,"vector_create_reserve",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,3,"Vector internal allocation error");
      free(__ptr);
      return (vector)0x0;
    }
    pcVar4 = "Vector allocation error";
    uVar2 = 0x57;
  }
  log_write_impl_va("metacall",uVar2,"vector_create_reserve",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                    ,3,pcVar4);
  return (vector)0x0;
}

Assistant:

vector vector_create_reserve(size_t type_size, size_t capacity)
{
	if (type_size > 0)
	{
		vector v = malloc(sizeof(struct vector_type));

		if (v == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Vector allocation error");

			return NULL;
		}

		v->type_size = type_size;
		v->capacity = (capacity < VECTOR_CAPACITY_MIN) ? VECTOR_CAPACITY_MIN : capacity;
		v->size = 0;
		v->data = malloc(v->capacity * v->type_size);

		if (v->data == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Vector internal allocation error");

			free(v);

			return NULL;
		}

		return v;
	}

	log_write("metacall", LOG_LEVEL_ERROR, "Vector invalid type size");

	return NULL;
}